

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addExecutionMode
          (Builder *this,Function *entryPoint,ExecutionMode mode,int value1,int value2,int value3)

{
  Id id;
  Instruction *pIVar1;
  value_type local_38;
  Instruction *local_30;
  Instruction *instr;
  int value3_local;
  int value2_local;
  int value1_local;
  ExecutionMode mode_local;
  Function *entryPoint_local;
  Builder *this_local;
  
  if (entryPoint != (Function *)0x0) {
    instr._0_4_ = value3;
    instr._4_4_ = value2;
    value3_local = value1;
    value2_local = mode;
    _value1_local = entryPoint;
    entryPoint_local = (Function *)this;
    pIVar1 = (Instruction *)::operator_new(0x60);
    spv::Instruction::Instruction(pIVar1,OpExecutionMode);
    local_30 = pIVar1;
    spv::Instruction::reserveOperands(pIVar1,3);
    pIVar1 = local_30;
    id = spv::Function::getId(_value1_local);
    spv::Instruction::addIdOperand(pIVar1,id);
    spv::Instruction::addImmediateOperand(local_30,value2_local);
    if (-1 < value3_local) {
      spv::Instruction::addImmediateOperand(local_30,value3_local);
    }
    if (-1 < (int)instr._4_4_) {
      spv::Instruction::addImmediateOperand(local_30,instr._4_4_);
    }
    if (-1 < (int)(uint)instr) {
      spv::Instruction::addImmediateOperand(local_30,(uint)instr);
    }
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
               local_30);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->executionModes,&local_38);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_38);
  }
  return;
}

Assistant:

void Builder::addExecutionMode(Function* entryPoint, ExecutionMode mode, int value1, int value2, int value3)
{
    // entryPoint can be null if we are in compile-only mode
    if (!entryPoint)
        return;

    Instruction* instr = new Instruction(OpExecutionMode);
    instr->reserveOperands(3);
    instr->addIdOperand(entryPoint->getId());
    instr->addImmediateOperand(mode);
    if (value1 >= 0)
        instr->addImmediateOperand(value1);
    if (value2 >= 0)
        instr->addImmediateOperand(value2);
    if (value3 >= 0)
        instr->addImmediateOperand(value3);

    executionModes.push_back(std::unique_ptr<Instruction>(instr));
}